

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O2

ExecutionResult __thiscall nigel::AST_Parser::onExecute(AST_Parser *this,CodeBase *base)

{
  shared_ptr<nigel::AstBlock> *this_00;
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  *plVar1;
  AST_Parser *this_01;
  byte bVar2;
  AST_Parser *this_02;
  _List_node_base *p_Var3;
  shared_ptr<nigel::AstExpr> expr;
  undefined1 local_40 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  (this->currItr)._M_node =
       (base->lexerStruct).
       super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  this->base = base;
  std::make_shared<nigel::AstBlock>();
  this_00 = &base->globalAst;
  std::__shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2> *)local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  this_01 = (AST_Parser *)(local_40 + 0x10);
  this_02 = this_01;
  std::__shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2> *)this_01,
             &this_00->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>);
  fillSFR(this_02,(shared_ptr<nigel::AstBlock> *)this_01);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  std::deque<std::shared_ptr<nigel::AstBlock>,_std::allocator<std::shared_ptr<nigel::AstBlock>_>_>::
  push_back(&(this->blockStack).c,this_00);
  this->finishedParsing = false;
  bVar2 = 0;
  while ((bVar2 & 1) == 0) {
    resolveNextExpr((AST_Parser *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
    bVar2 = this->finishedParsing;
  }
  plVar1 = &(this->super_BuilderExecutable).notificationList;
  p_Var3 = (_List_node_base *)plVar1;
  do {
    p_Var3 = (((_List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)plVar1) break;
  } while (0x7ffd < *(int *)p_Var3[1]._M_next - 1U);
  if (base->printAST == true) {
    printAST(this,base);
  }
  return (uint)(p_Var3 != (_List_node_base *)plVar1) * 5;
}

Assistant:

ExecutionResult AST_Parser::onExecute( CodeBase &base )
	{
		//Set current iterator
		currItr = base.lexerStruct.begin();
		this->base = &base;

		base.globalAst = std::make_shared<AstBlock>();
		fillSFR( base.globalAst );
		blockStack.push( base.globalAst );

		finishedParsing = false;

		while( !finishedParsing )//Iterate the lexer
		{
			std::shared_ptr<AstExpr> expr = resolveNextExpr();
		}

		bool hasError = false;
		for( auto &n : notificationList ) if( n->type > NT::begin_err && n->type < NT::begin_warning )
		{
			hasError = true;
			break;
		}

		if( base.printAST ) printAST( base );

		if( hasError ) return ExecutionResult::astParsingFailed;
		else return ExecutionResult::success;
	}